

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O1

int __thiscall FFont::GetCharCode(FFont *this,int code,bool needpic)

{
  int iVar1;
  int iVar2;
  uint code_00;
  uint uVar3;
  
  code_00 = code & 0xff;
  if ((uint)code < 0xffffff80) {
    code_00 = code;
  }
  iVar1 = this->FirstChar;
  iVar2 = this->LastChar;
  if ((iVar2 < (int)code_00 || (int)code_00 < iVar1) ||
     ((needpic && (this->Chars[(int)(code_00 - iVar1)].Pic == (FTexture *)0x0)))) {
    if ((code_00 - 0x61 < 0x1a) || ((~code_00 & 0xe0) == 0 && (code_00 & 0xfffffff7) != 0xf7)) {
      code_00 = code_00 - 0x20;
      if ((int)code_00 <= iVar2 && iVar1 <= (int)code_00) {
        if (!needpic) {
          return code_00;
        }
        if (this->Chars[(int)(code_00 - iVar1)].Pic != (FTexture *)0x0) {
          return code_00;
        }
      }
    }
    uVar3 = stripaccent(code_00);
    if (((uVar3 == code_00) || (iVar2 < (int)uVar3 || (int)uVar3 < iVar1)) ||
       ((code_00 = uVar3, needpic && (this->Chars[(int)(uVar3 - iVar1)].Pic == (FTexture *)0x0)))) {
      code_00 = 0xffffffff;
    }
  }
  return code_00;
}

Assistant:

int FFont::GetCharCode(int code, bool needpic) const
{
	if (code < 0 && code >= -128)
	{
		// regular chars turn negative when the 8th bit is set.
		code &= 255;
	}
	if (code >= FirstChar && code <= LastChar && (!needpic || Chars[code - FirstChar].Pic != NULL))
	{
		return code;
	}
	// Try converting lowercase characters to uppercase.
	if (myislower(code))
	{
		code -= 32;
		if (code >= FirstChar && code <= LastChar && (!needpic || Chars[code - FirstChar].Pic != NULL))
		{
			return code;
		}
	}
	// Try stripping accents from accented characters.
	int newcode = stripaccent(code);
	if (newcode != code)
	{
		code = newcode;
		if (code >= FirstChar && code <= LastChar && (!needpic || Chars[code - FirstChar].Pic != NULL))
		{
			return code;
		}
	}
	return -1;
}